

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

wstring * __thiscall
phosg::wstring_vprintf_abi_cxx11_
          (wstring *__return_storage_ptr__,phosg *this,wchar_t *fmt,__va_list_tag *va)

{
  int iVar1;
  size_t sVar2;
  va_list tmp_va;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sVar2 = wcslen((wchar_t *)this);
  ::std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::resize
            (__return_storage_ptr__,sVar2 * 2,L'\0');
  do {
    do {
      iVar1 = vswprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                        __return_storage_ptr__->_M_string_length,(wchar_t *)this,fmt);
    } while (iVar1 < 0);
  } while ((long)__return_storage_ptr__->_M_string_length < (long)iVar1);
  ::std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::resize
            (__return_storage_ptr__,(long)iVar1,L'\0');
  return __return_storage_ptr__;
}

Assistant:

wstring wstring_vprintf(const wchar_t* fmt, va_list va) {
  // TODO: use open_wmemstream when it's available on mac os
  wstring result;
  result.resize(wcslen(fmt) * 2); // silly guess

  ssize_t written = -1;
  while ((written < 0) || (written > static_cast<ssize_t>(result.size()))) {
    va_list tmp_va;
    va_copy(tmp_va, va);
    written = vswprintf(result.data(), result.size(), fmt, va);
    va_end(tmp_va);
  }
  result.resize(written);
  return result;
}